

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acbFunc.c
# Opt level: O2

Vec_Int_t * Acb_GetDerefedNodes(Acb_Ntk_t *p)

{
  int iVar1;
  Acb_ObjType_t AVar2;
  int iVar3;
  int iVar4;
  Vec_Ptr_t *p_00;
  Vec_Int_t *p_01;
  Vec_Int_t *p_02;
  char *pStr;
  Vec_Int_t *pVVar5;
  char *__format;
  
  pVVar5 = (Vec_Int_t *)0x0;
  p_00 = Abc_FrameReadSignalNames();
  if (p_00 != (Vec_Ptr_t *)0x0) {
    p_01 = Vec_IntAlloc(100);
    iVar1 = Abc_NamObjNumMax(p->pDesign->pStrs);
    p_02 = Vec_IntStartFull(iVar1);
    for (iVar1 = 1; iVar1 < (p->vObjType).nSize; iVar1 = iVar1 + 1) {
      AVar2 = Acb_ObjType(p,iVar1);
      if (AVar2 != ABC_OPER_NONE) {
        iVar3 = Acb_ObjName(p,iVar1);
        if (iVar3 != 0) {
          iVar3 = Acb_ObjName(p,iVar1);
          Vec_IntWriteEntry(p_02,iVar3,iVar1);
        }
      }
    }
    for (iVar1 = 0; pVVar5 = p_01, iVar1 < p_00->nSize; iVar1 = iVar1 + 1) {
      pStr = (char *)Vec_PtrEntry(p_00,iVar1);
      iVar3 = Abc_NamStrFindOrAdd(p->pDesign->pStrs,pStr,(int *)0x0);
      if (iVar3 == 0) {
        __format = "Cannot find name ID for name %s\n";
LAB_0032a29f:
        printf(__format,pStr);
        Vec_IntFree(p_02);
        pVVar5 = (Vec_Int_t *)0x0;
        p_02 = p_01;
        break;
      }
      iVar4 = Vec_IntEntry(p_02,iVar3);
      if (iVar4 == -1) {
        __format = "Cannot find obj ID for name %s\n";
        goto LAB_0032a29f;
      }
      iVar3 = Vec_IntEntry(p_02,iVar3);
      Vec_IntPush(p_01,iVar3);
    }
    Vec_IntFree(p_02);
  }
  return pVVar5;
}

Assistant:

Vec_Int_t * Acb_GetDerefedNodes( Acb_Ntk_t * p )
{
    Vec_Ptr_t * vNames = Abc_FrameReadSignalNames();
    if ( vNames != NULL )
    {
        Vec_Int_t * vNodes = Vec_IntAlloc( 100 );
        Vec_Int_t * vMap   = Vec_IntStartFull( Abc_NamObjNumMax(p->pDesign->pStrs) );
        int i, iObj; char * pName;
        Acb_NtkForEachObj( p, iObj )
            if ( Acb_ObjName(p, iObj) )
                Vec_IntWriteEntry( vMap, Acb_ObjName(p, iObj), iObj );
        Vec_PtrForEachEntry( char *, vNames, pName, i )
        {
            int NameId = Abc_NamStrFindOrAdd( p->pDesign->pStrs, pName, NULL );
            if ( NameId == 0 )
            {
                printf( "Cannot find name ID for name %s\n", pName );
                Vec_IntFree( vMap );
                Vec_IntFree( vNodes );
                return NULL;
            }
            else if ( Vec_IntEntry(vMap, NameId) == -1 )
            {
                printf( "Cannot find obj ID for name %s\n", pName );
                Vec_IntFree( vMap );
                Vec_IntFree( vNodes );
                return NULL;
            }
            else
                Vec_IntPush( vNodes, Vec_IntEntry(vMap, NameId) );
        }
        Vec_IntFree( vMap );
        return vNodes;
    }
    return NULL;
}